

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3b1cf::readTiledThing<Imf_3_2::TiledInputFile>
               (TiledInputFile *input,bool test)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *this;
  void *this_00;
  byte in_SIL;
  int iVar6;
  FrameBuffer *in_RDI;
  int actual_y_level;
  int y_level;
  int x_level;
  TileDescription t;
  int y_levels;
  int x_levels;
  FrameBuffer dummy;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int local_90;
  int local_8c;
  int iStack_80;
  int local_6c;
  int local_68;
  FrameBuffer *in_stack_ffffffffffffffd0;
  Header *in_stack_ffffffffffffffd8;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_ffffffffffffffe0;
  
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
            ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x141c08);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x141c15);
  Imf_3_2::TiledInputFile::header();
  doFrameBuffer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Imf_3_2::TiledInputFile::setFrameBuffer(in_RDI);
  if ((in_SIL & 1) != 0) {
    Imf_3_2::TiledInputFile::header();
    bVar1 = Imf_3_2::Header::hasType();
    if ((bVar1 & 1) != 0) {
      Imf_3_2::TiledInputFile::header();
      Imf_3_2::Header::type_abi_cxx11_();
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (bVar2) {
        std::operator<<((ostream *)&std::cerr,"tiled image/part didn\'t have tiledimage type\n");
      }
    }
  }
  Imf_3_2::TiledInputFile::header();
  lVar5 = Imf_3_2::Header::tileDescription();
  iStack_80 = (int)*(ulong *)(lVar5 + 8);
  switch(*(ulong *)(lVar5 + 8) & 0xffffffff) {
  case 0:
    local_68 = 1;
    local_6c = 1;
    break;
  case 1:
    local_68 = Imf_3_2::TiledInputFile::numXLevels();
    local_6c = 1;
    break;
  case 2:
    local_68 = Imf_3_2::TiledInputFile::numXLevels();
    local_6c = Imf_3_2::TiledInputFile::numYLevels();
    break;
  case 3:
  default:
    this = std::operator<<((ostream *)&std::cerr,"Invalid tile mode ");
    this_00 = (void *)std::ostream::operator<<(this,iStack_80);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_6c = 0;
    local_68 = 0;
  }
  for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < local_6c; local_90 = local_90 + 1) {
      in_stack_ffffffffffffff04 = local_8c;
      if (iStack_80 == 2) {
        in_stack_ffffffffffffff04 = local_90;
      }
      iVar6 = (int)in_RDI;
      in_stack_ffffffffffffff00 = Imf_3_2::TiledInputFile::numXTiles(iVar6);
      iVar3 = in_stack_ffffffffffffff00 + -1;
      iVar4 = Imf_3_2::TiledInputFile::numYTiles(iVar6);
      Imf_3_2::TiledInputFile::readTiles(iVar6,0,iVar3,0,iVar4 + -1,local_8c);
    }
  }
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x141f82);
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector
            ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return;
}

Assistant:

void
readTiledThing (T& input, bool test)
{
    vector<half> value;
    FrameBuffer  dummy;
    doFrameBuffer (value, input.header (), dummy);
    input.setFrameBuffer (dummy);
    int x_levels;
    int y_levels;

    if (test && input.header ().hasType ())
    {
        if (input.header ().type () != TILEDIMAGE)
        {
            std::cerr << "tiled image/part didn't have tiledimage type\n";
            //assert(input.type()==TILEDIMAGE);
        }
    }

    TileDescription t = input.header ().tileDescription ();
    switch (t.mode)
    {
        case ONE_LEVEL:
            x_levels = 1;
            y_levels = 1;
            break;
        case MIPMAP_LEVELS:
            x_levels = input.numXLevels ();
            y_levels = 1;
            break;
        case RIPMAP_LEVELS:
            x_levels = input.numXLevels ();
            y_levels = input.numYLevels ();
            break;
        case NUM_LEVELMODES:
        default:
            std::cerr << "Invalid tile mode " << int (t.mode) << std::endl;
            x_levels = y_levels = 0;
            break;
    }

    for (int x_level = 0; x_level < x_levels; x_level++)
    {
        for (int y_level = 0; y_level < y_levels; y_level++)
        {
            // unless we are RIPMapped, the y_level=x_level, not 0
            int actual_y_level = t.mode == RIPMAP_LEVELS ? y_level : x_level;

            input.readTiles (
                0,
                input.numXTiles (x_level) - 1,
                0,
                input.numYTiles (actual_y_level) - 1,
                x_level,
                actual_y_level);
        }
    }
}